

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O0

mz_zip_reader_extract_iter_state *
mz_zip_reader_extract_file_iter_new(mz_zip_archive *pZip,char *pFilename,mz_uint flags)

{
  int iVar1;
  mz_uint local_28;
  mz_uint local_24;
  mz_uint32 file_index;
  mz_uint flags_local;
  char *pFilename_local;
  mz_zip_archive *pZip_local;
  
  local_24 = flags;
  _file_index = pFilename;
  pFilename_local = (char *)pZip;
  iVar1 = mz_zip_reader_locate_file_v2(pZip,pFilename,(char *)0x0,flags,&local_28);
  if (iVar1 == 0) {
    pZip_local = (mz_zip_archive *)0x0;
  }
  else {
    pZip_local = (mz_zip_archive *)
                 mz_zip_reader_extract_iter_new((mz_zip_archive *)pFilename_local,local_28,local_24)
    ;
  }
  return (mz_zip_reader_extract_iter_state *)pZip_local;
}

Assistant:

mz_zip_reader_extract_iter_state* mz_zip_reader_extract_file_iter_new(mz_zip_archive *pZip, const char *pFilename, mz_uint flags)
{
    mz_uint32 file_index;

    /* Locate file index by name */
    if (!mz_zip_reader_locate_file_v2(pZip, pFilename, NULL, flags, &file_index))
        return NULL;

    /* Construct iterator */
    return mz_zip_reader_extract_iter_new(pZip, file_index, flags);
}